

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O3

void sapp_toggle_fullscreen(void)

{
  XWindowAttributes attribs;
  undefined1 local_90 [8];
  int local_88;
  int iStack_84;
  
  _sapp.fullscreen = !_sapp.fullscreen;
  _sapp_x11_set_fullscreen(_sapp.fullscreen);
  XGetWindowAttributes(_sapp.x11.display,_sapp.x11.window,local_90);
  _sapp.window_width = local_88;
  _sapp.window_height = iStack_84;
  _sapp.framebuffer_width = local_88;
  _sapp.framebuffer_height = iStack_84;
  return;
}

Assistant:

_SOKOL_PRIVATE void _sapp_x11_toggle_fullscreen(void) {
    _sapp.fullscreen = !_sapp.fullscreen;
    _sapp_x11_set_fullscreen(_sapp.fullscreen);
    _sapp_x11_query_window_size();
}